

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

void iterate_rc4(uchar *data,size_t data_len,uchar *okey,int key_len,int iterations,bool reverse)

{
  uint uVar1;
  unsigned_long __n;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> key;
  uchar *indata;
  uint uVar2;
  int iVar3;
  undefined4 in_register_00000084;
  uint uVar4;
  __array key_ph;
  RC4 rc4;
  int local_54;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_50;
  size_t local_48;
  RC4 local_40;
  
  iVar3 = iterations;
  local_54 = key_len;
  local_48 = data_len;
  __n = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_54);
  key.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)operator_new__(__n)
  ;
  uVar4 = 0;
  memset((void *)key.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
  uVar2 = 0;
  if (0 < iterations) {
    uVar2 = iterations;
  }
  local_50._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       key.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    uVar1 = ~uVar4 + iterations;
    if (!reverse) {
      uVar1 = uVar4;
    }
    for (indata = (uchar *)0x0; (long)indata < (long)local_54; indata = indata + 1) {
      indata[(long)key.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl] =
           okey[(long)indata] ^ (byte)uVar1;
    }
    RC4::RC4(&local_40,
             (RC4_KEY *)
             key.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(long)local_54,indata,
             (uchar *)CONCAT44(in_register_00000084,iVar3));
    RC4::process(&local_40,data,local_48,data);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_50);
  return;
}

Assistant:

static void
iterate_rc4(
    unsigned char* data,
    size_t data_len,
    unsigned char* okey,
    int key_len,
    int iterations,
    bool reverse)
{
    auto key_ph = std::make_unique<unsigned char[]>(QIntC::to_size(key_len));
    unsigned char* key = key_ph.get();
    for (int i = 0; i < iterations; ++i) {
        int const xor_value = (reverse ? iterations - 1 - i : i);
        for (int j = 0; j < key_len; ++j) {
            key[j] = static_cast<unsigned char>(okey[j] ^ xor_value);
        }
        RC4 rc4(key, QIntC::to_int(key_len));
        rc4.process(data, data_len, data);
    }
}